

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableInit(Thread *this,Instr instr,Ptr *out_trap)

{
  pointer pEVar1;
  Result RVar2;
  u64 uVar3;
  RunResult RVar4;
  Store *pSVar5;
  Value VVar6;
  Value VVar7;
  allocator<char> local_81;
  Ptr table;
  Ptr local_68;
  string local_50;
  
  pSVar5 = (Store *)&table;
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)pSVar5,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pEVar1 = (this->inst_->elems_).
           super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  VVar6 = Pop(this);
  VVar7 = Pop(this);
  uVar3 = PopPtr(this,(Ptr *)pSVar5);
  RVar2 = Table::Init(table.obj_,pSVar5,(u32)uVar3,pEVar1 + instr.field_2.imm_u32x2.snd,
                      VVar7.field_0.i32_,VVar6.field_0.i32_);
  RVar4 = Ok;
  if (RVar2.enum_ == Error) {
    pSVar5 = this->store_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"out of bounds table access: table.init out of bounds",&local_81)
    ;
    Trap::New(&local_68,pSVar5,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar4 = Trap;
  }
  RefPtr<wabt::interp::Table>::reset(&table);
  return RVar4;
}

Assistant:

RunResult Thread::DoTableInit(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32x2.fst]};
  auto&& elem = inst_->elems()[instr.imm_u32x2.snd];
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  u64 dst = PopPtr(table);
  TRAP_IF(Failed(table->Init(store_, dst, elem, src, size)),
          "out of bounds table access: table.init out of bounds");
  return RunResult::Ok;
}